

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map,_func_void_void_ptr *freevalue)

{
  SUNHashMapKeyValue *__ptr;
  SUNHashMapKeyValue __ptr_00;
  long lVar1;
  
  if (freevalue != (_func_void_void_ptr *)0x0 && map != (SUNHashMap *)0x0) {
    lVar1 = 0;
    while( true ) {
      __ptr = (*map)->buckets;
      if ((*map)->max_size <= lVar1) break;
      __ptr_00 = __ptr[lVar1];
      if (__ptr_00 == (SUNHashMapKeyValue)0x0) {
        __ptr_00 = (SUNHashMapKeyValue)0x0;
      }
      else if (__ptr_00->value != (void *)0x0) {
        (*freevalue)(__ptr_00->value);
        __ptr_00 = (*map)->buckets[lVar1];
      }
      free(__ptr_00);
      lVar1 = lVar1 + 1;
    }
    free(__ptr);
    free(*map);
    *map = (SUNHashMap)0x0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map, void (*freevalue)(void* ptr))
{
  int i;

  if (map == NULL || freevalue == NULL) { return SUN_SUCCESS; }

  for (i = 0; i < (*map)->max_size; i++)
  {
    if ((*map)->buckets[i] && (*map)->buckets[i]->value)
    {
      freevalue((*map)->buckets[i]->value);
    }

    if ((*map)->buckets[i]) { free((*map)->buckets[i]); }
  }
  if ((*map)->buckets) { free((*map)->buckets); }
  if (*map) { free(*map); }
  *map = NULL;

  return SUN_SUCCESS;
}